

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O1

JavascriptString *
Js::ScriptFunction::GetComputedName(Var computedNameVar,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptString *pJVar4;
  
  if (computedNameVar == (Var)0x0) {
    return (JavascriptString *)0x0;
  }
  if (((ulong)computedNameVar & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)computedNameVar & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((ulong)computedNameVar & 0xffff000000000000) == 0x1000000000000) {
    pJVar4 = TaggedInt::ToString(computedNameVar,scriptContext);
    return pJVar4;
  }
  pJVar4 = JavascriptConversion::ToString(computedNameVar,scriptContext);
  return pJVar4;
}

Assistant:

JavascriptString* ScriptFunction::GetComputedName(Var computedNameVar, ScriptContext * scriptContext)
    {
        JavascriptString* computedName = nullptr;
        if (computedNameVar != nullptr)
        {
            if (TaggedInt::Is(computedNameVar))
            {
                computedName = TaggedInt::ToString(computedNameVar, scriptContext);
            }
            else
            {
                computedName = JavascriptConversion::ToString(computedNameVar, scriptContext);
            }
            return computedName;
        }
        return nullptr;
    }